

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

bool __thiscall irr::video::COpenGLDriver::endScene(COpenGLDriver *this)

{
  int iVar1;
  
  CNullDriver::endScene(&this->super_CNullDriver);
  glFlush();
  if (this->ContextManager != (IContextManager *)0x0) {
    iVar1 = (*this->ContextManager->_vptr_IContextManager[9])();
    return SUB41(iVar1,0);
  }
  return false;
}

Assistant:

bool COpenGLDriver::endScene()
{
	CNullDriver::endScene();

	glFlush();

	bool status = false;

	if (ContextManager)
		status = ContextManager->swapBuffers();

	// todo: console device present

	return status;
}